

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void absl::lts_20250127::log_internal::anon_unknown_4::WriteToStream(char *data,void *os)

{
  ostream *cast_os;
  
  std::operator<<((ostream *)os,data);
  return;
}

Assistant:

void WriteToStream(const char* data, void* os) {
  auto* cast_os = static_cast<std::ostream*>(os);
  *cast_os << data;
}